

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

int __thiscall
google::protobuf::Reflection::GetRepeatedEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  RepeatedField<int> *this_00;
  const_reference piVar4;
  Nonnull<const_char_*> pcVar5;
  bool v1;
  char *description;
  Descriptor *pDVar6;
  Metadata MVar7;
  
  MVar7 = Message::GetMetadata(message);
  if (MVar7.reflection != this) {
    pDVar6 = this->descriptor_;
    MVar7 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar6,MVar7.descriptor,field,"GetRepeatedEnumValue");
  }
  pDVar6 = this->descriptor_;
  if (field->containing_type_ == pDVar6) {
    bVar1 = field->field_0x1;
    v1 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == v1) {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (v1,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar5 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"GetRepeatedEnumValue",CPPTYPE_ENUM);
        }
        if ((field->field_0x1 & 8) == 0) {
          this_00 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
          piVar4 = RepeatedField<int>::Get(this_00,index);
          return *piVar4;
        }
        uVar2 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        iVar3 = protobuf::internal::ExtensionSet::GetRepeatedEnum
                          ((ExtensionSet *)
                           ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                           field->number_,index);
        return iVar3;
      }
    }
    else {
      GetRepeatedEnumValue();
    }
    pDVar6 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar6,field,"GetRepeatedEnumValue",description);
}

Assistant:

int Reflection::GetRepeatedEnumValue(const Message& message,
                                     const FieldDescriptor* field,
                                     int index) const {
  USAGE_CHECK_ALL(GetRepeatedEnumValue, REPEATED, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetRepeatedEnum(field->number(), index);
  } else {
    value = GetRepeatedField<int>(message, field, index);
  }
  return value;
}